

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O2

bool __thiscall
cmCMakeHostSystemInformationCommand::InitialPass
          (cmCMakeHostSystemInformationCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  SystemInformation info;
  string result_list;
  string variable;
  string value;
  string key;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if (((ulong)((long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)__lhs) < 0x21) ||
     (bVar2 = std::operator!=(__lhs,"RESULT"), bVar2)) {
    std::__cxx11::string::string
              ((string *)&variable,"missing RESULT specification.",(allocator *)&result_list);
    cmCommand::SetError(&this->super_cmCommand,&variable);
    std::__cxx11::string::~string((string *)&variable);
    return false;
  }
  std::__cxx11::string::string
            ((string *)&variable,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 1));
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (((ulong)((long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x80) ||
     (bVar2 = std::operator!=(pbVar1 + 2,"QUERY"), bVar2)) {
    std::__cxx11::string::string
              ((string *)&result_list,"missing QUERY specification",(allocator *)&key);
    cmCommand::SetError(&this->super_cmCommand,&result_list);
    std::__cxx11::string::~string((string *)&result_list);
    bVar2 = false;
  }
  else {
    cmsys::SystemInformation::SystemInformation(&info);
    cmsys::SystemInformation::RunCPUCheck(&info);
    cmsys::SystemInformation::RunOSCheck(&info);
    cmsys::SystemInformation::RunMemoryCheck(&info);
    result_list._M_dataplus._M_p = (pointer)&result_list.field_2;
    result_list._M_string_length = 0;
    result_list.field_2._M_local_buf[0] = '\0';
    uVar5 = 3;
    lVar4 = 0x60;
    while( true ) {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      bVar2 = (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <=
              uVar5;
      if (bVar2) break;
      std::__cxx11::string::string
                ((string *)&key,(string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar4));
      if (uVar5 != 3) {
        std::__cxx11::string::append((char *)&result_list);
      }
      value._M_dataplus._M_p = (pointer)&value.field_2;
      value._M_string_length = 0;
      value.field_2._M_local_buf[0] = '\0';
      bVar3 = GetValue(this,&info,&key,&value);
      if (!bVar3) {
        std::__cxx11::string::~string((string *)&value);
        std::__cxx11::string::~string((string *)&key);
        goto LAB_0036e2d1;
      }
      std::__cxx11::string::append((string *)&result_list);
      std::__cxx11::string::~string((string *)&value);
      std::__cxx11::string::~string((string *)&key);
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x20;
    }
    cmMakefile::AddDefinition
              ((this->super_cmCommand).Makefile,&variable,result_list._M_dataplus._M_p);
LAB_0036e2d1:
    std::__cxx11::string::~string((string *)&result_list);
    cmsys::SystemInformation::~SystemInformation(&info);
  }
  std::__cxx11::string::~string((string *)&variable);
  return bVar2;
}

Assistant:

bool cmCMakeHostSystemInformationCommand
::InitialPass(std::vector<std::string> const &args, cmExecutionStatus &)
{
  size_t current_index = 0;

  if(args.size() < (current_index + 2) || args[current_index] != "RESULT")
    {
    this->SetError("missing RESULT specification.");
    return false;
    }

  std::string variable = args[current_index + 1];
  current_index += 2;

  if(args.size() < (current_index + 2) || args[current_index] != "QUERY")
    {
    this->SetError("missing QUERY specification");
    return false;
    }

  cmsys::SystemInformation info;
  info.RunCPUCheck();
  info.RunOSCheck();
  info.RunMemoryCheck();

  std::string result_list;
  for(size_t i = current_index + 1; i < args.size(); ++i)
    {
    std::string key = args[i];
    if(i != current_index + 1)
      {
      result_list += ";";
      }
    std::string value;
    if(!this->GetValue(info, key, value)) return false;

    result_list += value;
    }

  this->Makefile->AddDefinition(variable, result_list.c_str());

  return true;
}